

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O0

cio_error enqueue_job(cio_websocket *websocket,cio_websocket_write_job *job,size_t length)

{
  cio_error err_00;
  cio_error err;
  size_t length_local;
  cio_websocket_write_job *job_local;
  cio_websocket *websocket_local;
  
  if ((websocket->ws_private).first_write_job == (cio_websocket_write_job *)0x0) {
    (websocket->ws_private).first_write_job = job;
    (websocket->ws_private).last_write_job = job;
    err_00 = send_frame(websocket,job,length);
    if (err_00 != CIO_SUCCESS) {
      handle_error(websocket,err_00,CIO_WEBSOCKET_CLOSE_INTERNAL_ERROR,"Could not send frame");
      return err_00;
    }
  }
  else {
    ((websocket->ws_private).last_write_job)->next = job;
    (websocket->ws_private).last_write_job = job;
  }
  return CIO_SUCCESS;
}

Assistant:

static enum cio_error enqueue_job(struct cio_websocket *websocket, struct cio_websocket_write_job *job, size_t length)
{
	if (websocket->ws_private.first_write_job == NULL) {
		websocket->ws_private.first_write_job = job;
		websocket->ws_private.last_write_job = job;
		enum cio_error err = send_frame(websocket, job, length);
		if (cio_unlikely(err != CIO_SUCCESS)) {
			handle_error(websocket, err, CIO_WEBSOCKET_CLOSE_INTERNAL_ERROR, "Could not send frame");
			return err;
		}
	} else {
		websocket->ws_private.last_write_job->next = job;
		websocket->ws_private.last_write_job = job;
	}

	return CIO_SUCCESS;
}